

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.h
# Opt level: O2

void __thiscall chrono::ChRotSpringShape::~ChRotSpringShape(ChRotSpringShape *this)

{
  ChLineShape::~ChLineShape(&this->super_ChLineShape);
  Eigen::internal::handmade_aligned_free(this);
  return;
}

Assistant:

class ChApi ChRotSpringShape : public ChLineShape {
  public:
    ChRotSpringShape(double radius, int resolution = 65) : m_radius(radius), m_resolution(resolution) {}

    virtual void Update(ChPhysicsItem* updater, const ChFrame<>& coords) override;

  private:
    double m_radius;
    size_t m_resolution;
}